

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O2

bool __thiscall
cmConditionEvaluator::HandleLevel4
          (cmConditionEvaluator *this,cmArgumentList *newArgs,string *errorString,
          MessageType *status)

{
  iterator iVar1;
  string *psVar2;
  MessageType *pMVar3;
  bool bVar4;
  bool bVar5;
  _Self __tmp;
  _List_node_base *p_Var6;
  cmConditionEvaluator *pcVar7;
  _Self __tmp_1;
  iterator iVar8;
  int reducible;
  iterator arg;
  int local_5c;
  iterator local_58;
  iterator local_50;
  iterator local_48;
  string *local_40;
  MessageType *local_38;
  
  local_40 = errorString;
  local_38 = status;
  do {
    local_5c = 0;
    for (p_Var6 = (newArgs->
                  super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                  )._M_impl._M_node.super__List_node_base._M_next;
        p_Var6 != (_List_node_base *)newArgs;
        p_Var6 = (((_List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                    *)&p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
      iVar8._M_node =
           (((_List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
            &p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      local_58._M_node = iVar8._M_node;
      local_50._M_node = iVar8._M_node;
      local_48._M_node = p_Var6;
      if (iVar8._M_node != (_List_node_base *)newArgs) {
        local_58._M_node = (iVar8._M_node)->_M_next;
        bVar4 = IsKeyword(this,&keyAND_abi_cxx11_,(cmExpandedCommandArgument *)(iVar8._M_node + 1));
        pMVar3 = local_38;
        psVar2 = local_40;
        iVar1._M_node = local_58._M_node;
        if ((bVar4) && (local_58._M_node != (_List_node_base *)newArgs)) {
          bVar4 = GetBooleanValueWithAutoDereference
                            (this,(cmExpandedCommandArgument *)(p_Var6 + 1),local_40,local_38,false)
          ;
          pcVar7 = this;
          bVar5 = GetBooleanValueWithAutoDereference
                            (this,(cmExpandedCommandArgument *)(iVar1._M_node + 1),psVar2,pMVar3,
                             false);
          HandleBinaryOp(pcVar7,bVar5 && bVar4,&local_5c,&local_48,newArgs,&local_50,&local_58);
          iVar8._M_node = local_50._M_node;
        }
      }
      if (((iVar8._M_node != (_List_node_base *)newArgs) &&
          (bVar4 = IsKeyword(this,&keyOR_abi_cxx11_,(cmExpandedCommandArgument *)(iVar8._M_node + 1)
                            ), pMVar3 = local_38, psVar2 = local_40,
          iVar8._M_node = local_58._M_node, bVar4)) &&
         (local_58._M_node != (_List_node_base *)newArgs)) {
        bVar4 = GetBooleanValueWithAutoDereference
                          (this,(cmExpandedCommandArgument *)(p_Var6 + 1),local_40,local_38,false);
        pcVar7 = this;
        bVar5 = GetBooleanValueWithAutoDereference
                          (this,(cmExpandedCommandArgument *)(iVar8._M_node + 1),psVar2,pMVar3,false
                          );
        HandleBinaryOp(pcVar7,bVar5 || bVar4,&local_5c,&local_48,newArgs,&local_50,&local_58);
      }
    }
  } while (local_5c != 0);
  return true;
}

Assistant:

bool cmConditionEvaluator::HandleLevel4(cmArgumentList& newArgs,
                                        std::string& errorString,
                                        cmake::MessageType& status)
{
  int reducible;
  bool lhs;
  bool rhs;
  do {
    reducible = 0;
    cmArgumentList::iterator arg = newArgs.begin();
    cmArgumentList::iterator argP1;
    cmArgumentList::iterator argP2;
    while (arg != newArgs.end()) {
      argP1 = arg;
      IncrementArguments(newArgs, argP1, argP2);
      if (argP1 != newArgs.end() && IsKeyword(keyAND, *argP1) &&
          argP2 != newArgs.end()) {
        lhs =
          this->GetBooleanValueWithAutoDereference(*arg, errorString, status);
        rhs = this->GetBooleanValueWithAutoDereference(*argP2, errorString,
                                                       status);
        this->HandleBinaryOp((lhs && rhs), reducible, arg, newArgs, argP1,
                             argP2);
      }

      if (argP1 != newArgs.end() && this->IsKeyword(keyOR, *argP1) &&
          argP2 != newArgs.end()) {
        lhs =
          this->GetBooleanValueWithAutoDereference(*arg, errorString, status);
        rhs = this->GetBooleanValueWithAutoDereference(*argP2, errorString,
                                                       status);
        this->HandleBinaryOp((lhs || rhs), reducible, arg, newArgs, argP1,
                             argP2);
      }
      ++arg;
    }
  } while (reducible);
  return true;
}